

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

matrix4x4_f32_t * prf_state_get_inverse_matrix(prf_state_t *state)

{
  float32_t *pfVar1;
  float fVar2;
  float32_t fVar3;
  undefined4 uVar4;
  uint uVar5;
  float32_t *pfVar6;
  matrix4x4_f32_t *paafVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  float32_t *pfVar17;
  float32_t *pfVar18;
  float32_t *pfVar19;
  ulong uVar20;
  float32_t *pfVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  uint auStack_38 [4];
  int p [4];
  
  if (state->inv_dirty != 0) {
    pfVar6 = (float32_t *)state->inv_matrix;
    paafVar7 = state->matrix[state->state_push_level];
    uVar8 = *(undefined8 *)(*paafVar7)[0];
    uVar9 = *(undefined8 *)((*paafVar7)[0] + 2);
    uVar10 = *(undefined8 *)(*paafVar7)[1];
    uVar11 = *(undefined8 *)((*paafVar7)[1] + 2);
    uVar12 = *(undefined8 *)(*paafVar7)[2];
    uVar13 = *(undefined8 *)((*paafVar7)[2] + 2);
    uVar14 = *(undefined8 *)((*paafVar7)[3] + 2);
    *(undefined8 *)(pfVar6 + 0xc) = *(undefined8 *)(*paafVar7)[3];
    *(undefined8 *)(pfVar6 + 0xe) = uVar14;
    *(undefined8 *)(pfVar6 + 8) = uVar12;
    *(undefined8 *)(pfVar6 + 10) = uVar13;
    *(undefined8 *)(pfVar6 + 4) = uVar10;
    *(undefined8 *)(pfVar6 + 6) = uVar11;
    *(undefined8 *)pfVar6 = uVar8;
    *(undefined8 *)(pfVar6 + 2) = uVar9;
    lVar16 = 0;
    pfVar18 = pfVar6;
    pfVar19 = pfVar6;
    pfVar21 = pfVar6;
    for (uVar20 = 0; uVar20 != 4; uVar20 = uVar20 + 1) {
      auStack_38[uVar20] = 0;
      fVar25 = 0.0;
      uVar22 = 0;
      pfVar17 = pfVar21;
      for (uVar23 = uVar20; uVar23 != 4; uVar23 = uVar23 + 1) {
        fVar26 = 0.0;
        for (lVar24 = -4; uVar20 + lVar24 != 0; lVar24 = lVar24 + 1) {
          fVar26 = fVar26 + ABS((float)pfVar17[lVar24 + 4]);
        }
        fVar2 = (float)pfVar6[uVar23 * 4 + uVar20];
        if (fVar25 < ABS(fVar2) / fVar26) {
          auStack_38[uVar20] = (uint)uVar23;
          uVar22 = uVar23 & 0xffffffff;
          fVar25 = ABS(fVar2) / fVar26;
        }
        pfVar17 = pfVar17 + 4;
      }
      if ((fVar25 == 0.0) && (!NAN(fVar25))) {
        if (uVar20 < 4) {
          return (matrix4x4_f32_t *)0x0;
        }
        goto LAB_001049f9;
      }
      if (uVar20 != uVar22) {
        for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
          fVar3 = pfVar19[lVar24];
          pfVar19[lVar24] = pfVar6[(long)(int)uVar22 * 4 + lVar24];
          pfVar6[(long)(int)uVar22 * 4 + lVar24] = fVar3;
        }
      }
      fVar25 = (float)pfVar6[uVar20 * 5];
      pfVar17 = pfVar6;
      for (uVar23 = 0; uVar23 != 4; uVar23 = uVar23 + 1) {
        if (uVar23 != uVar20) {
          pfVar1 = pfVar6 + uVar20 * 4 + uVar23;
          *pfVar1 = (float32_t)(-(float)*pfVar1 / fVar25);
          for (lVar24 = 0; lVar24 != 0x40; lVar24 = lVar24 + 0x10) {
            if (lVar16 != lVar24) {
              *(float *)((long)pfVar17 + lVar24) =
                   *(float *)((long)pfVar18 + lVar24) * (float)*pfVar1 +
                   *(float *)((long)pfVar17 + lVar24);
            }
          }
        }
        pfVar17 = pfVar17 + 1;
      }
      for (lVar24 = 0; lVar24 != 0x40; lVar24 = lVar24 + 0x10) {
        *(float *)((long)pfVar18 + lVar24) = *(float *)((long)pfVar18 + lVar24) / fVar25;
      }
      pfVar6[uVar20 * 5] = (float32_t)(1.0 / fVar25);
      pfVar21 = pfVar21 + 5;
      pfVar19 = pfVar19 + 4;
      pfVar18 = pfVar18 + 1;
      lVar16 = lVar16 + 0x10;
    }
    for (uVar15 = 2; -1 < (int)uVar15; uVar15 = uVar15 - 1) {
      uVar20 = (ulong)uVar15;
      uVar5 = auStack_38[uVar20];
      if (uVar5 != uVar15) {
        for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
          uVar4 = *(undefined4 *)((long)pfVar6 + lVar16 + uVar20 * 4);
          *(undefined4 *)((long)pfVar6 + lVar16 + uVar20 * 4) =
               *(undefined4 *)((long)pfVar6 + lVar16 + (long)(int)uVar5 * 4);
          *(undefined4 *)((long)pfVar6 + lVar16 + (long)(int)uVar5 * 4) = uVar4;
        }
      }
    }
    state->inv_dirty = 0;
  }
LAB_001049f9:
  return state->inv_matrix;
}

Assistant:

matrix4x4_f32_t *
prf_state_get_inverse_matrix(
    prf_state_t * state )
{
    assert( state != NULL );

    if ( state->inv_dirty != FALSE ) {
        float32_t max, pivot, s, q, (*a)[4];
        int i, j, k, p[4];

        a = (float32_t (*)[4]) state->inv_matrix;
        memcpy( state->inv_matrix, state->matrix[ state->state_push_level ],
            sizeof( matrix4x4_f32_t ) ); 

        for ( k = 0; k < 4; k++ ) {
            max = 0.0f;
            p[k] = 0;
            for ( i = k; i < 4; i++ ) {
                s = 0.0;
                for ( j = k; j < 4; j++ )
                    s += (float32_t)fabs( a[i][j] );
                q = (float32_t)fabs( a[i][k] ) / s;
                if ( q > max ) {
                    max = q;
                    p[k] = i;
                }
            }
            if ( max == 0.0f )
                return NULL;
            if ( p[k] != k ) {
                for ( j = 0; j < 4; j++ ) {
                    float32_t h;
                    h = a[k][j];
                    a[k][j] = a[p[k]][j];
                    a[p[k]][j] = h;
                }
            }
            pivot = a[k][k];
            for ( j = 0; j < 4; j++ ) {
                if ( j != k ) {
                    a[k][j] = - a[k][j] / pivot;
                    for ( i = 0; i < 4; i++ )
                        if ( i != k )
                            a[i][j] += a[i][k] * a[k][j];
                }
            }
            for ( i = 0; i < 4; i++ )
                a[i][k] /= pivot;
            a[k][k] = 1 / pivot;
        }
        for ( k = 4 - 2; k >= 0; k-- ) {
            if ( p[k] != k ) {
                for ( i = 0; i < 4; i++ ) {
                    float32_t h;
                    h = a[i][k];
                    a[i][k] = a[i][p[k]];
                    a[i][p[k]] = h;
                }
            }
        }
        state->inv_dirty = FALSE;
    }

    return state->inv_matrix;
}